

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_pi_iterator_t *
opj_pi_initialise_encode
          (opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no,J2K_T2_MODE p_t2_mode)

{
  opj_tcp_t *poVar1;
  opj_pi_iterator_t *poVar2;
  OPJ_INT32 OVar3;
  uint p_nb_elements;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  opj_pi_iterator_t *p_pi;
  OPJ_INT16 *pOVar6;
  OPJ_UINT32 *pOVar7;
  OPJ_UINT32 *local_e0;
  opj_pi_resolution_t *l_res_1;
  opj_pi_resolution_t *l_res;
  OPJ_UINT32 *l_encoding_value_ptr;
  opj_pi_iterator_t *l_current_pi;
  opj_image_comp_t *l_img_comp;
  opj_pi_comp_t *l_current_comp;
  opj_tccp_t *l_tccp;
  opj_tcp_t *l_tcp;
  opj_pi_iterator_t *l_pi;
  OPJ_UINT32 l_data_stride;
  OPJ_UINT32 l_step_l;
  OPJ_UINT32 l_step_r;
  OPJ_UINT32 l_step_c;
  OPJ_UINT32 l_step_p;
  OPJ_UINT32 l_bound;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  OPJ_UINT32 **l_tmp_ptr;
  OPJ_UINT32 *l_tmp_data;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_UINT32 pino;
  OPJ_UINT32 numcomps;
  J2K_T2_MODE p_t2_mode_local;
  OPJ_UINT32 p_tile_no_local;
  opj_cp_t *p_cp_local;
  opj_image_t *p_image_local;
  
  compno = p_image->numcomps;
  pino = p_t2_mode;
  numcomps = p_tile_no;
  _p_t2_mode_local = p_cp;
  p_cp_local = (opj_cp_t *)p_image;
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x632,
                  "opj_pi_iterator_t *opj_pi_initialise_encode(const opj_image_t *, opj_cp_t *, OPJ_UINT32, J2K_T2_MODE)"
                 );
  }
  if (p_image == (opj_image_t *)0x0) {
    __assert_fail("p_image != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x633,
                  "opj_pi_iterator_t *opj_pi_initialise_encode(const opj_image_t *, opj_cp_t *, OPJ_UINT32, J2K_T2_MODE)"
                 );
  }
  if (p_cp->tw * p_cp->th <= p_tile_no) {
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x634,
                  "opj_pi_iterator_t *opj_pi_initialise_encode(const opj_image_t *, opj_cp_t *, OPJ_UINT32, J2K_T2_MODE)"
                 );
  }
  poVar1 = p_cp->tcps;
  p_nb_elements = poVar1[p_tile_no].numpocs + 1;
  l_tmp_ptr = (OPJ_UINT32 **)opj_malloc((ulong)(compno * 0x84) << 2);
  if (l_tmp_ptr == (OPJ_UINT32 **)0x0) {
    p_image_local = (opj_image_t *)0x0;
  }
  else {
    _l_max_prec = (OPJ_UINT32 **)opj_malloc((ulong)compno << 3);
    if (_l_max_prec == (OPJ_UINT32 **)0x0) {
      opj_free(l_tmp_ptr);
      p_image_local = (opj_image_t *)0x0;
    }
    else {
      p_pi = opj_pi_create((opj_image_t *)p_cp_local,_p_t2_mode_local,numcomps);
      if (p_pi == (opj_pi_iterator_t *)0x0) {
        opj_free(l_tmp_ptr);
        opj_free(_l_max_prec);
        p_image_local = (opj_image_t *)0x0;
      }
      else {
        l_res = (opj_pi_resolution_t *)l_tmp_ptr;
        for (l_tmp_data._4_4_ = 0; l_tmp_data._4_4_ < compno;
            l_tmp_data._4_4_ = l_tmp_data._4_4_ + 1) {
          _l_max_prec[l_tmp_data._4_4_] = &l_res->pdx;
          l_res = l_res + 0x21;
        }
        opj_get_all_encoding_parameters
                  ((opj_image_t *)p_cp_local,_p_t2_mode_local,numcomps,&l_ty0,&l_ty1,
                   (OPJ_INT32 *)&l_dx_min,(OPJ_INT32 *)&l_dy_min,&l_bound,&l_step_p,
                   (OPJ_UINT32 *)&l_tx1,(OPJ_UINT32 *)&l_tx0,_l_max_prec);
        OVar3 = l_tx1;
        OVar4 = compno * l_tx1;
        OVar5 = l_tx0 * OVar4;
        p_pi->tp_on = *(byte *)((long)&_p_t2_mode_local->m_specific_param + 0x11) >> 3 & 1;
        p_pi->include_size = poVar1[p_tile_no].numlayers * OVar5;
        pOVar6 = (OPJ_INT16 *)opj_calloc((ulong)p_pi->include_size,2);
        p_pi->include = pOVar6;
        if (p_pi->include == (OPJ_INT16 *)0x0) {
          opj_free(l_tmp_ptr);
          opj_free(_l_max_prec);
          opj_pi_destroy(p_pi,p_nb_elements);
          p_image_local = (opj_image_t *)0x0;
        }
        else {
          l_img_comp = (opj_image_comp_t *)p_pi->comps;
          l_current_pi = (opj_pi_iterator_t *)p_cp_local->comment;
          p_pi->tx0 = l_ty0;
          p_pi->ty0 = l_dx_min;
          p_pi->tx1 = l_ty1;
          p_pi->ty1 = l_dy_min;
          p_pi->dx = l_bound;
          p_pi->dy = l_step_p;
          p_pi->step_p = 1;
          p_pi->step_c = OVar3;
          p_pi->step_r = OVar4;
          p_pi->step_l = OVar5;
          for (l_tmp_data._4_4_ = 0; l_tmp_data._4_4_ < compno;
              l_tmp_data._4_4_ = l_tmp_data._4_4_ + 1) {
            l_res_1 = *(opj_pi_resolution_t **)&l_img_comp->x0;
            l_res = (opj_pi_resolution_t *)_l_max_prec[l_tmp_data._4_4_];
            l_img_comp->dx = *(OPJ_UINT32 *)l_current_pi;
            l_img_comp->dy = *(OPJ_UINT32 *)&l_current_pi->field_0x4;
            for (l_tmp_data._0_4_ = 0; (uint)l_tmp_data < l_img_comp->w;
                l_tmp_data._0_4_ = (uint)l_tmp_data + 1) {
              l_res_1->pdx = l_res->pdx;
              l_res_1->pdy = l_res->pdy;
              pOVar7 = &l_res->ph;
              l_res_1->pw = l_res->pw;
              l_res = l_res + 1;
              l_res_1->ph = *pOVar7;
              l_res_1 = l_res_1 + 1;
            }
            l_img_comp = (opj_image_comp_t *)&l_img_comp->prec;
            l_current_pi = (opj_pi_iterator_t *)&(l_current_pi->poc).layno1;
          }
          poVar2 = p_pi;
          for (resno = 1; l_encoding_value_ptr = (OPJ_UINT32 *)(poVar2 + 1), resno < p_nb_elements;
              resno = resno + 1) {
            l_img_comp = (opj_image_comp_t *)poVar2[1].comps;
            l_current_pi = (opj_pi_iterator_t *)p_cp_local->comment;
            poVar2[1].tx0 = l_ty0;
            poVar2[1].ty0 = l_dx_min;
            poVar2[1].tx1 = l_ty1;
            poVar2[1].ty1 = l_dy_min;
            poVar2[1].dx = l_bound;
            poVar2[1].dy = l_step_p;
            poVar2[1].step_p = 1;
            poVar2[1].step_c = OVar3;
            poVar2[1].step_r = OVar4;
            poVar2[1].step_l = OVar5;
            for (l_tmp_data._4_4_ = 0; l_tmp_data._4_4_ < compno;
                l_tmp_data._4_4_ = l_tmp_data._4_4_ + 1) {
              local_e0 = *(OPJ_UINT32 **)&l_img_comp->x0;
              l_res = (opj_pi_resolution_t *)_l_max_prec[l_tmp_data._4_4_];
              l_img_comp->dx = *(OPJ_UINT32 *)l_current_pi;
              l_img_comp->dy = *(OPJ_UINT32 *)&l_current_pi->field_0x4;
              for (l_tmp_data._0_4_ = 0; (uint)l_tmp_data < l_img_comp->w;
                  l_tmp_data._0_4_ = (uint)l_tmp_data + 1) {
                *local_e0 = l_res->pdx;
                local_e0[1] = l_res->pdy;
                pOVar7 = &l_res->ph;
                local_e0[2] = l_res->pw;
                l_res = l_res + 1;
                local_e0[3] = *pOVar7;
                local_e0 = local_e0 + 4;
              }
              l_img_comp = (opj_image_comp_t *)&l_img_comp->prec;
              l_current_pi = (opj_pi_iterator_t *)&(l_current_pi->poc).layno1;
            }
            poVar2[1].include = poVar2->include;
            poVar2[1].include_size = poVar2->include_size;
            poVar2 = (opj_pi_iterator_t *)l_encoding_value_ptr;
          }
          opj_free(l_tmp_ptr);
          l_tmp_ptr = (OPJ_UINT32 **)0x0;
          opj_free(_l_max_prec);
          _l_max_prec = (OPJ_UINT32 **)0x0;
          p_image_local = (opj_image_t *)p_pi;
          if ((((byte)poVar1[p_tile_no].field_0x1638 >> 2 & 1) == 0) ||
             (((_p_t2_mode_local->rsiz < 3 || (6 < _p_t2_mode_local->rsiz)) && (pino != 1)))) {
            opj_pi_update_encode_not_poc
                      (_p_t2_mode_local,compno,numcomps,l_ty0,l_ty1,l_dx_min,l_dy_min,l_tx1,l_tx0,
                       l_bound,l_step_p);
          }
          else {
            opj_pi_update_encode_poc_and_final
                      (_p_t2_mode_local,numcomps,l_ty0,l_ty1,l_dx_min,l_dy_min,l_tx1,l_tx0,l_bound,
                       l_step_p);
          }
        }
      }
    }
  }
  return (opj_pi_iterator_t *)p_image_local;
}

Assistant:

opj_pi_iterator_t *opj_pi_initialise_encode(const opj_image_t *p_image,
        opj_cp_t *p_cp,
        OPJ_UINT32 p_tile_no,
        J2K_T2_MODE p_t2_mode)
{
    OPJ_UINT32 numcomps = p_image->numcomps;

    /* loop*/
    OPJ_UINT32 pino;
    OPJ_UINT32 compno, resno;

    /* to store w, h, dx and dy fro all components and resolutions*/
    OPJ_UINT32 * l_tmp_data;
    OPJ_UINT32 ** l_tmp_ptr;

    /* encoding prameters to set*/
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;
    OPJ_UINT32 l_bound;
    OPJ_UINT32 l_step_p, l_step_c, l_step_r, l_step_l ;
    OPJ_UINT32 l_data_stride;

    /* pointers*/
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *l_tcp = 00;
    const opj_tccp_t *l_tccp = 00;
    opj_pi_comp_t *l_current_comp = 00;
    opj_image_comp_t * l_img_comp = 00;
    opj_pi_iterator_t * l_current_pi = 00;
    OPJ_UINT32 * l_encoding_value_ptr = 00;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    /* initializations*/
    l_tcp = &p_cp->tcps[p_tile_no];
    l_bound = l_tcp->numpocs + 1;

    l_data_stride = 4 * OPJ_J2K_MAXRLVLS;
    l_tmp_data = (OPJ_UINT32*)opj_malloc(
                     l_data_stride * numcomps * sizeof(OPJ_UINT32));
    if (! l_tmp_data) {
        return 00;
    }

    l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
                    numcomps * sizeof(OPJ_UINT32 *));
    if (! l_tmp_ptr) {
        opj_free(l_tmp_data);
        return 00;
    }

    /* memory allocation for pi*/
    l_pi = opj_pi_create(p_image, p_cp, p_tile_no);
    if (!l_pi) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        return 00;
    }

    l_encoding_value_ptr = l_tmp_data;
    /* update pointer array*/
    for (compno = 0; compno < numcomps; ++compno) {
        l_tmp_ptr[compno] = l_encoding_value_ptr;
        l_encoding_value_ptr += l_data_stride;
    }

    /* get encoding parameters*/
    opj_get_all_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1,
                                    &l_ty0, &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res, l_tmp_ptr);

    /* step calculations*/
    l_step_p = 1;
    l_step_c = l_max_prec * l_step_p;
    l_step_r = numcomps * l_step_c;
    l_step_l = l_max_res * l_step_r;

    /* set values for first packet iterator*/
    l_pi->tp_on = (OPJ_BYTE)p_cp->m_specific_param.m_enc.m_tp_on;
    l_current_pi = l_pi;

    /* memory allocation for include*/
    l_current_pi->include_size = l_tcp->numlayers * l_step_l;
    l_current_pi->include = (OPJ_INT16*) opj_calloc(l_current_pi->include_size,
                            sizeof(OPJ_INT16));
    if (!l_current_pi->include) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        opj_pi_destroy(l_pi, l_bound);
        return 00;
    }

    /* special treatment for the first packet iterator*/
    l_current_comp = l_current_pi->comps;
    l_img_comp = p_image->comps;
    l_tccp = l_tcp->tccps;
    l_current_pi->tx0 = l_tx0;
    l_current_pi->ty0 = l_ty0;
    l_current_pi->tx1 = l_tx1;
    l_current_pi->ty1 = l_ty1;
    l_current_pi->dx = l_dx_min;
    l_current_pi->dy = l_dy_min;
    l_current_pi->step_p = l_step_p;
    l_current_pi->step_c = l_step_c;
    l_current_pi->step_r = l_step_r;
    l_current_pi->step_l = l_step_l;

    /* allocation for components and number of components has already been calculated by opj_pi_create */
    for (compno = 0; compno < numcomps; ++compno) {
        opj_pi_resolution_t *l_res = l_current_comp->resolutions;
        l_encoding_value_ptr = l_tmp_ptr[compno];

        l_current_comp->dx = l_img_comp->dx;
        l_current_comp->dy = l_img_comp->dy;

        /* resolutions have already been initialized */
        for (resno = 0; resno < l_current_comp->numresolutions; resno++) {
            l_res->pdx = *(l_encoding_value_ptr++);
            l_res->pdy = *(l_encoding_value_ptr++);
            l_res->pw =  *(l_encoding_value_ptr++);
            l_res->ph =  *(l_encoding_value_ptr++);
            ++l_res;
        }

        ++l_current_comp;
        ++l_img_comp;
        ++l_tccp;
    }
    ++l_current_pi;

    for (pino = 1 ; pino < l_bound ; ++pino) {
        l_current_comp = l_current_pi->comps;
        l_img_comp = p_image->comps;
        l_tccp = l_tcp->tccps;

        l_current_pi->tx0 = l_tx0;
        l_current_pi->ty0 = l_ty0;
        l_current_pi->tx1 = l_tx1;
        l_current_pi->ty1 = l_ty1;
        l_current_pi->dx = l_dx_min;
        l_current_pi->dy = l_dy_min;
        l_current_pi->step_p = l_step_p;
        l_current_pi->step_c = l_step_c;
        l_current_pi->step_r = l_step_r;
        l_current_pi->step_l = l_step_l;

        /* allocation for components and number of components has already been calculated by opj_pi_create */
        for (compno = 0; compno < numcomps; ++compno) {
            opj_pi_resolution_t *l_res = l_current_comp->resolutions;
            l_encoding_value_ptr = l_tmp_ptr[compno];

            l_current_comp->dx = l_img_comp->dx;
            l_current_comp->dy = l_img_comp->dy;
            /* resolutions have already been initialized */
            for (resno = 0; resno < l_current_comp->numresolutions; resno++) {
                l_res->pdx = *(l_encoding_value_ptr++);
                l_res->pdy = *(l_encoding_value_ptr++);
                l_res->pw =  *(l_encoding_value_ptr++);
                l_res->ph =  *(l_encoding_value_ptr++);
                ++l_res;
            }
            ++l_current_comp;
            ++l_img_comp;
            ++l_tccp;
        }

        /* special treatment*/
        l_current_pi->include = (l_current_pi - 1)->include;
        l_current_pi->include_size = (l_current_pi - 1)->include_size;
        ++l_current_pi;
    }

    opj_free(l_tmp_data);
    l_tmp_data = 00;
    opj_free(l_tmp_ptr);
    l_tmp_ptr = 00;

    if (l_tcp->POC && (OPJ_IS_CINEMA(p_cp->rsiz) || p_t2_mode == FINAL_PASS)) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }

    return l_pi;
}